

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetLinSysFn(void *arkode_mem,ARKLsLinSysFn linsys)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  ARKLsMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x3f6;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x110) != 0) {
      iVar1 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeSetLinSysFn",&arkls_mem);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (linsys == (ARKLsLinSysFn)0x0) {
        arkls_mem->user_linsys = 0;
        arkls_mem->linsys = arkLsLinSys;
        arkls_mem->A_data = arkode_mem;
      }
      else {
        if (arkls_mem->A == (SUNMatrix)0x0) {
          msgfmt = "Linear system setup routine cannot be supplied for NULL SUNMatrix";
          error_code = -3;
          iVar1 = 0x40b;
          goto LAB_00138c77;
        }
        arkls_mem->user_linsys = 1;
        arkls_mem->linsys = linsys;
        arkls_mem->A_data = *(void **)((long)arkode_mem + 0x10);
      }
      return 0;
    }
    msgfmt = "time-stepping module does not require an algebraic solver";
    error_code = -0x30;
    iVar1 = 0x3ff;
  }
LAB_00138c77:
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetLinSysFn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetLinSysFn(void* arkode_mem, ARKLsLinSysFn linsys)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (arkls_mem->A == NULL))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return (ARKLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL)
  {
    arkls_mem->user_linsys = SUNTRUE;
    arkls_mem->linsys      = linsys;
    arkls_mem->A_data      = ark_mem->user_data;
  }
  else
  {
    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = arkLsLinSys;
    arkls_mem->A_data      = ark_mem;
  }

  return (ARKLS_SUCCESS);
}